

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::deriv
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nderiv)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  Index IVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 *puVar7;
  Index index;
  ulong uVar8;
  long lVar9;
  ChebyshevExpansion *pCVar10;
  Index size;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  double dVar14;
  undefined1 auVar15 [16];
  vectype c;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  vectype local_48;
  ChebyshevExpansion *local_38;
  
  local_38 = __return_storage_ptr__;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)this);
  if (Nderiv != 0) {
    sVar13 = 0;
    do {
      IVar4 = local_58.m_rows;
      local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      if (local_58.m_rows < 1) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      uVar11 = local_58.m_rows - 1;
      pdVar5 = local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (uVar11 != 0) {
        if (0x1fffffffffffffff < uVar11) {
LAB_0010a257:
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = operator_new;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar5 = (double *)malloc(uVar11 * 8);
        if (uVar11 != 1 && ((ulong)pdVar5 & 0xf) != 0) goto LAB_0010a285;
        if (pdVar5 == (double *)0x0) goto LAB_0010a257;
      }
      local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar5;
      pCVar10 = local_38;
      pdVar5 = local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      dVar2 = this->m_xmax;
      dVar3 = this->m_xmin;
      uVar8 = 0;
      do {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar11;
        if (uVar8 == uVar11) {
LAB_0010a238:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar8] = 0.0;
        uVar1 = uVar8 + 1;
        dVar14 = 0.0;
        uVar12 = uVar1;
        if (uVar8 < uVar11) {
          do {
            if (((int)uVar12 - (int)uVar8 & 1U) != 0) {
              if (local_58.m_rows <= (long)uVar12) goto LAB_0010a238;
              lVar9 = uVar12 * 2;
              auVar15._8_4_ = (int)((ulong)lVar9 >> 0x20);
              auVar15._0_8_ = lVar9;
              auVar15._12_4_ = 0x45300000;
              dVar14 = dVar14 + ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) *
                                local_58.m_data[uVar12];
              local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[uVar8] = dVar14;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 <= uVar11);
        }
        if (uVar8 == 0) {
          if (IVar4 == 1) goto LAB_0010a238;
          *local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = *local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data * 0.5;
          dVar14 = *local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
        }
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar8] = dVar14 / ((dVar2 - dVar3) * 0.5);
        uVar8 = uVar1;
      } while (uVar1 != uVar11);
      if (Nderiv == 1) {
        ChebyshevExpansion(local_38,&local_48,this->m_xmin,this->m_xmax);
        free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        goto LAB_0010a21d;
      }
      pdVar6 = local_58.m_data;
      uVar8 = local_58.m_rows;
      if (local_58.m_rows != uVar11) {
        free(local_58.m_data);
        if (0x1fffffffffffffff < uVar11) {
LAB_0010a2c3:
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = operator_new;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar6 = (double *)malloc(uVar11 * 8);
        if (uVar11 != 1 && ((ulong)pdVar6 & 0xf) != 0) {
LAB_0010a285:
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        uVar8 = uVar11;
        if (pdVar6 == (double *)0x0) goto LAB_0010a2c3;
      }
      local_58.m_rows = uVar8;
      local_58.m_data = pdVar6;
      uVar8 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (2 < IVar4) {
        lVar9 = 0;
        do {
          pdVar6 = pdVar5 + lVar9;
          dVar2 = pdVar6[1];
          local_58.m_data[lVar9] = *pdVar6;
          (local_58.m_data + lVar9)[1] = dVar2;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar11) {
        do {
          local_58.m_data[uVar8] = pdVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar11 != uVar8);
      }
      free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      sVar13 = sVar13 + 1;
    } while (sVar13 != Nderiv);
  }
  pCVar10 = local_38;
  ChebyshevExpansion(local_38,(vectype *)&local_58,this->m_xmin,this->m_xmax);
LAB_0010a21d:
  free(local_58.m_data);
  return pCVar10;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::deriv(std::size_t Nderiv) const {
        // See Mason and Handscomb, p. 34, Eq. 2.52
        // and example in https ://github.com/numpy/numpy/blob/master/numpy/polynomial/chebyshev.py#L868-L964
        vectype c = m_c;
        for (std::size_t deriv_counter = 0; deriv_counter < Nderiv; ++deriv_counter) {
            std::size_t N = c.size() - 1, ///< Order of the expansion
                        Nd = N - 1; ///< Order of the derivative expansion
            vectype cd(N);
            for (std::size_t r = 0; r <= Nd; ++r) {
                cd(r) = 0;
                for (std::size_t k = r + 1; k <= N; ++k) {
                    // Terms where k-r is odd have values, otherwise, they are zero
                    if ((k - r) % 2 == 1) {
                        cd(r) += 2*k*c(k);
                    }
                }
                // The first term with r = 0 is divided by 2 (the single prime in Mason and Handscomb, p. 34, Eq. 2.52)
                if (r == 0) {
                    cd(r) /= 2;
                }
                // Rescale the values if the range is not [-1,1].  Arrives from the derivative of d(xreal)/d(x_{-1,1})
                cd(r) /= (m_xmax-m_xmin)/2.0;
            }
            if (Nderiv == 1) {
                return ChebyshevExpansion(std::move(cd), m_xmin, m_xmax);
            }
            else{
                c = cd;
            }
        }
        return ChebyshevExpansion(std::move(c), m_xmin, m_xmax);
    }